

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::load(list_caster<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  PyObject *pPVar3;
  object *poVar4;
  PyObject *pPVar5;
  undefined1 local_90 [8];
  reference it;
  undefined1 local_68 [8];
  value_conv conv;
  handle local_40;
  sequence s;
  
  if (((src.m_ptr == (PyObject *)0x0) || (iVar2 = PySequence_Check(src.m_ptr), iVar2 == 0)) ||
     (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0)) {
    return false;
  }
  (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
  local_40.m_ptr = src.m_ptr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->value,
                    (this->value).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  __n = sequence::size((sequence *)&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->value,__n);
  it.cache.super_handle.m_ptr = (handle)(handle)local_40.m_ptr;
  pPVar3 = (PyObject *)PySequence_Size();
  bVar1 = true;
  if (pPVar3 != (PyObject *)0x0) {
    conv.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value.field_2._12_4_ = ZEXT14(convert);
    pPVar5 = (PyObject *)0x0;
    do {
      it._0_8_ = it.cache.super_handle.m_ptr;
      it.key = 0;
      local_68 = (undefined1  [8])
                 &conv.
                  super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  .value._M_string_length;
      conv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value._M_dataplus._M_p = (pointer)0x0;
      conv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value._M_string_length._0_1_ = 0;
      it.obj.m_ptr = pPVar5;
      poVar4 = accessor<pybind11::detail::accessor_policies::sequence_item>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::sequence_item> *)local_90);
      s.super_object.super_handle.m_ptr = (object)(poVar4->super_handle).m_ptr;
      if (s.super_object.super_handle.m_ptr != (handle)0x0) {
        ((PyObject *)s.super_object.super_handle.m_ptr)->ob_refcnt =
             ((PyObject *)s.super_object.super_handle.m_ptr)->ob_refcnt + 1;
      }
      bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)local_68,(handle)s.super_object.super_handle.m_ptr,
                     SUB41(conv.
                           super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           .value.field_2._12_4_,0));
      object::~object(&s.super_object);
      if (!bVar1) {
        if (local_68 !=
            (undefined1  [8])
            &conv.
             super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             .value._M_string_length) {
          operator_delete((void *)local_68,
                          CONCAT71(conv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length._1_7_,
                                   (undefined1)
                                   conv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length) + 1);
        }
        object::~object((object *)&it.key);
        bVar1 = false;
        goto LAB_002a48cf;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      if (local_68 !=
          (undefined1  [8])
          &conv.
           super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .value._M_string_length) {
        operator_delete((void *)local_68,
                        CONCAT71(conv.
                                 super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 .value._M_string_length._1_7_,
                                 (undefined1)
                                 conv.
                                 super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 .value._M_string_length) + 1);
      }
      object::~object((object *)&it.key);
      pPVar5 = (PyObject *)((long)&pPVar5->ob_refcnt + 1);
    } while (pPVar3 != pPVar5);
    bVar1 = true;
  }
LAB_002a48cf:
  object::~object((object *)&local_40);
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }